

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O3

DFA<covenant::Sym> *
covenant::witness_impl::to_automata<covenant::Sym>
          (DFA<covenant::Sym> *__return_storage_ptr__,witness_t *witness,TermFactory *tfac)

{
  State SVar1;
  State SVar2;
  sp_counted_base *psVar3;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  sockaddr *__addr_00;
  State unaff_EBP;
  State unaff_R12D;
  uint i;
  int i_00;
  ulong uVar4;
  uint local_60;
  Sym local_5c;
  ulong local_58;
  element_type *local_50;
  shared_count local_48;
  element_type *local_40;
  shared_count local_38;
  
  local_50 = tfac->px;
  if ((witness->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (witness->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    psVar3 = (tfac->pn).pi_;
    if (psVar3 == (sp_counted_base *)0x0) {
      (__return_storage_ptr__->_tfac).px = local_50;
      (__return_storage_ptr__->_tfac).pn.pi_ = (sp_counted_base *)0x0;
    }
    else {
      LOCK();
      psVar3->use_count_ = psVar3->use_count_ + 1;
      UNLOCK();
      (__return_storage_ptr__->_tfac).px = local_50;
      (__return_storage_ptr__->_tfac).pn.pi_ = psVar3;
      LOCK();
      psVar3->use_count_ = psVar3->use_count_ + 1;
      UNLOCK();
    }
    __return_storage_ptr__->start = 0;
    (__return_storage_ptr__->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (__return_storage_ptr__->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    (__return_storage_ptr__->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    (__return_storage_ptr__->trans).
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->trans).
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->trans).
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->eps).
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->eps).
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->eps).
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->eps).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4) = 0;
    local_40 = local_50;
    local_38.pi_ = psVar3;
    boost::detail::shared_count::~shared_count(&local_38);
    SVar2 = DFA<covenant::Sym>::state(__return_storage_ptr__,0);
    SVar1 = DFA<covenant::Sym>::state(__return_storage_ptr__,1);
    __return_storage_ptr__->start = SVar2.id;
    DFA<covenant::Sym>::accept(__return_storage_ptr__,SVar1.id,__addr_00,(socklen_t *)psVar3);
  }
  else {
    psVar3 = (tfac->pn).pi_;
    if (psVar3 == (sp_counted_base *)0x0) {
      (__return_storage_ptr__->_tfac).px = local_50;
      (__return_storage_ptr__->_tfac).pn.pi_ = (sp_counted_base *)0x0;
    }
    else {
      LOCK();
      psVar3->use_count_ = psVar3->use_count_ + 1;
      UNLOCK();
      (__return_storage_ptr__->_tfac).px = local_50;
      (__return_storage_ptr__->_tfac).pn.pi_ = psVar3;
      LOCK();
      psVar3->use_count_ = psVar3->use_count_ + 1;
      UNLOCK();
    }
    uVar4 = 0;
    __return_storage_ptr__->start = 0;
    (__return_storage_ptr__->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (__return_storage_ptr__->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    (__return_storage_ptr__->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    (__return_storage_ptr__->trans).
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->trans).
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->trans).
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->eps).
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->eps).
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->eps).
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->eps).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->accepts).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4) = 0;
    local_48.pi_ = psVar3;
    boost::detail::shared_count::~shared_count(&local_48);
    local_58 = (ulong)((long)(witness->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(witness->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 2;
    do {
      i_00 = (int)uVar4;
      SVar1 = DFA<covenant::Sym>::state(__return_storage_ptr__,i_00);
      __addr = extraout_RDX;
      SVar2 = SVar1;
      if (i_00 != 0) {
        local_5c.x = (witness->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[i_00 - 1] * 2;
        psVar3 = (sp_counted_base *)(ulong)SVar1.id;
        DFA<covenant::Sym>::transition(__return_storage_ptr__,unaff_R12D,&local_5c,SVar1);
        __addr = extraout_RDX_00;
        SVar2.id = local_60;
        if ((int)local_58 == i_00) {
          unaff_EBP = SVar1;
        }
      }
      local_60 = SVar2.id;
      uVar4 = (ulong)(i_00 + 1);
      unaff_R12D = SVar1;
    } while (uVar4 <= (ulong)((long)(witness->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                    .super__Vector_impl_data._M_finish -
                              (long)(witness->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                    .super__Vector_impl_data._M_start >> 2));
    __return_storage_ptr__->start = local_60;
    DFA<covenant::Sym>::accept(__return_storage_ptr__,unaff_EBP.id,__addr,(socklen_t *)psVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

DFA<EdgeSym> to_automata(const witness_t &witness, TermFactory tfac)
  {
    if (witness.empty())
    {
      DFA<EdgeSym> dfa (tfac);
      State start = dfa.state(0);
      State final = dfa.state(1);
      dfa.setStart(start);
      dfa.accept(final);
      return dfa;
    }

    DFA<EdgeSym> dfa (tfac);
    State start, final;
    State prev , curr;
    unsigned n = witness.size();
    for(unsigned i=0; i<= witness.size(); i++)
    {
      curr = dfa.state(i);
      if (i == 0)
        start = curr;
      else
      {
        if (i == n)
        {
          final = curr;
        }
        dfa.transition(prev, EdgeSym::mkTerm(witness[i-1]), curr);
      }
      prev = curr;
    }
    dfa.setStart(start);
    dfa.accept(final);
    return dfa;
  }